

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localization_backend.cpp
# Opt level: O2

void __thiscall
booster::locale::localization_backend_manager::impl::add_backend
          (impl *this,string *name,
          unique_ptr<booster::locale::localization_backend,_std::default_delete<booster::locale::localization_backend>_>
          *backend_ptr)

{
  pointer ppVar1;
  pointer piVar2;
  pointer piVar3;
  __type _Var4;
  uint uVar5;
  shared_ptr<booster::locale::localization_backend> sptr;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>
  local_50;
  
  std::__shared_ptr<booster::locale::localization_backend,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<booster::locale::localization_backend,std::default_delete<booster::locale::localization_backend>,void>
            ((__shared_ptr<booster::locale::localization_backend,(__gnu_cxx::_Lock_policy)2> *)&sptr
             ,backend_ptr);
  if ((this->all_backends_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->all_backends_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>
    ::pair<std::shared_ptr<booster::locale::localization_backend>_&,_true>(&local_50,name,&sptr);
    std::
    vector<std::pair<std::__cxx11::string,std::shared_ptr<booster::locale::localization_backend>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<booster::locale::localization_backend>>>>
    ::
    emplace_back<std::pair<std::__cxx11::string,std::shared_ptr<booster::locale::localization_backend>>>
              ((vector<std::pair<std::__cxx11::string,std::shared_ptr<booster::locale::localization_backend>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<booster::locale::localization_backend>>>>
                *)this,&local_50);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>
    ::~pair(&local_50);
    piVar2 = (this->default_backends_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (this->default_backends_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (uVar5 = 0; (ulong)uVar5 < (ulong)((long)piVar3 - (long)piVar2 >> 2); uVar5 = uVar5 + 1) {
      piVar2[uVar5] = 0;
    }
  }
  else {
    uVar5 = 0;
    do {
      ppVar1 = (this->all_backends_).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->all_backends_).
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1) / 0x30) <=
          (ulong)uVar5) {
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>
        ::pair<std::shared_ptr<booster::locale::localization_backend>_&,_true>(&local_50,name,&sptr)
        ;
        std::
        vector<std::pair<std::__cxx11::string,std::shared_ptr<booster::locale::localization_backend>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<booster::locale::localization_backend>>>>
        ::
        emplace_back<std::pair<std::__cxx11::string,std::shared_ptr<booster::locale::localization_backend>>>
                  ((vector<std::pair<std::__cxx11::string,std::shared_ptr<booster::locale::localization_backend>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<booster::locale::localization_backend>>>>
                    *)this,&local_50);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>
        ::~pair(&local_50);
        break;
      }
      _Var4 = std::operator==(&ppVar1[uVar5].first,name);
      uVar5 = uVar5 + 1;
    } while (!_Var4);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sptr.
              super___shared_ptr<booster::locale::localization_backend,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void add_backend(std::string const &name,std::unique_ptr<localization_backend> backend_ptr)
            {
                booster::shared_ptr<localization_backend> sptr(std::move(backend_ptr));
                if(all_backends_.empty()) {
                    all_backends_.push_back(std::make_pair(name,sptr));
                    for(unsigned i=0;i<default_backends_.size();i++)
                        default_backends_[i]=0;
                }
                else { 
                    for(unsigned i=0;i<all_backends_.size();i++)
                        if(all_backends_[i].first == name)
                            return;
                    all_backends_.push_back(std::make_pair(name,sptr));
                }
            }